

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

int easm_isimm(easm_expr *expr)

{
  easm_expr_type eVar1;
  int iVar2;
  bool local_1d;
  easm_expr *expr_local;
  
  eVar1 = expr->type;
  if (eVar1 - EASM_EXPR_LOR < 0xc) {
    iVar2 = easm_isimm(expr->e1);
    local_1d = false;
    if (iVar2 != 0) {
      iVar2 = easm_isimm(expr->e2);
      local_1d = iVar2 != 0;
    }
    expr_local._4_4_ = (uint)local_1d;
  }
  else if (eVar1 - EASM_EXPR_NEG < 3) {
    expr_local._4_4_ = easm_isimm(expr->e1);
  }
  else if ((eVar1 == EASM_EXPR_NUM) || (eVar1 == EASM_EXPR_LABEL)) {
    expr_local._4_4_ = 1;
  }
  else {
    expr_local._4_4_ = 0;
  }
  return expr_local._4_4_;
}

Assistant:

int easm_isimm(struct easm_expr *expr) {
	switch (expr->type) {
		case EASM_EXPR_LOR:
		case EASM_EXPR_LAND:
		case EASM_EXPR_OR:
		case EASM_EXPR_XOR:
		case EASM_EXPR_AND:
		case EASM_EXPR_SHL:
		case EASM_EXPR_SHR:
		case EASM_EXPR_ADD:
		case EASM_EXPR_SUB:
		case EASM_EXPR_MUL:
		case EASM_EXPR_DIV:
		case EASM_EXPR_MOD:
			return easm_isimm(expr->e1) && easm_isimm(expr->e2);
		case EASM_EXPR_NEG:
		case EASM_EXPR_NOT:
		case EASM_EXPR_LNOT:
			return easm_isimm(expr->e1);
		case EASM_EXPR_NUM:
		case EASM_EXPR_LABEL:
			return 1;
		default:
			return 0;
	}
}